

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  bool bVar9;
  uint uVar10;
  long lVar11;
  undefined8 *puVar12;
  ostream *poVar13;
  byte *pbVar14;
  ulong uVar15;
  long lVar16;
  runtime_error *prVar17;
  ulong uVar18;
  byte *pbVar19;
  byte bVar20;
  ulong uVar21;
  uint uVar22;
  byte *pbVar23;
  byte bVar24;
  ulong uVar25;
  uint __len;
  ulong unaff_R13;
  uint uVar26;
  int iVar27;
  byte *pbVar28;
  byte *pbVar29;
  bool bVar30;
  bool bVar31;
  double dVar32;
  string s;
  string __str;
  double local_118;
  byte *local_110;
  long local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar27 = 0;
  printf("FLT_EVAL_METHOD = %d\n",0);
  dVar32 = pow(10.0,-308.0);
  if ((dVar32 != 1e-308) || (NAN(dVar32))) {
    puts(
        "It appears that your system has bad floating-point support since 1e-308 differs from std::pow(10,-308)."
        );
    printf("Aborting further tests.");
  }
  else {
    issue2093();
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"1090544144181609348835077142190","");
    bVar9 = basic_test_64bit(&local_50,1.0905441441816094e+30);
    if (!bVar9) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar17,"bug");
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"4503599627370496.5","");
    bVar9 = basic_test_64bit(&local_70,4503599627370496.0);
    if (!bVar9) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar17,"bug");
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"4503599627370497.5","");
    bVar9 = basic_test_64bit(&local_90,4503599627370498.0);
    if (!bVar9) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar17,"bug");
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375"
               ,"");
    bVar9 = basic_test_64bit(&local_b0,4.4501477170144023e-308);
    if (!bVar9) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar17,"bug");
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375"
               ,"");
    bVar9 = basic_test_64bit(&local_d0,2.225073858507201e-308);
    if (!bVar9) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar17,"bug");
      __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    issue63();
    issue40();
    issue23();
    issue32();
    issue50_fastpath();
    issue50_off_fastpath();
    issue23_2();
    unit_tests();
    uVar22 = 0xfffffece;
    bVar9 = false;
    iVar27 = 0;
    do {
      uVar18 = (ulong)uVar22;
      if (uVar22 == 0x17) {
        uVar18 = 0x18;
      }
      putchar(0x2e);
      fflush((FILE *)0x0);
      uVar26 = (uint)uVar18;
      lVar11 = (long)(int)uVar26;
      if (lVar11 + 0x16U < 0x2d) {
        if ((int)uVar26 < 0) {
          dVar32 = 1.0 / *(double *)
                          (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                           power_of_ten + lVar11 * -8);
        }
        else {
          dVar32 = *(double *)
                    (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                     power_of_ten + lVar11 * 8);
        }
LAB_00107275:
        unaff_R13 = 1;
      }
      else {
        uVar15 = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                            mantissa_64 + lVar11 * 8 + 0xa28);
        uVar21 = uVar15 << 0x3f;
        if (((uVar22 == 0xd2) || (uVar22 == 0x7e)) && (uVar21 != 0)) {
          bVar30 = (*(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                               mantissa_128 + lVar11 * 8 + 0xa28) >> 1 | uVar21) ==
                   0xffffffffffffffff;
          bVar31 = (*(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                               mantissa_128 + lVar11 * 8 + 0xa28) & 1) == 0;
          unaff_R13 = unaff_R13 & 0xff;
          if ((!bVar31 && (lVar11 == 0xd2 || lVar11 == 0x7e)) && bVar30) {
            unaff_R13 = 0;
          }
          uVar21 = 1;
          if ((bVar31 || lVar11 != 0xd2 && lVar11 != 0x7e) || !bVar30) goto LAB_001071ae;
          dVar32 = 0.0;
        }
        else {
LAB_001071ae:
          dVar32 = 0.0;
          if ((((uint)uVar15 & 0xc00) == 0x400 && uVar21 == 0) && uVar26 < 0x18) {
            unaff_R13 = 0;
          }
          else {
            uVar21 = (uVar15 >> 10) + (ulong)(((uint)uVar15 >> 10 & 1) != 0);
            unaff_R13 = 0;
            uVar15 = ((lVar11 * 0x3526a >> 0x10) + 0x43f) -
                     (0x40 - (ulong)(0x3fffffffffffff < uVar21));
            if ((uVar15 != 0) && (uVar15 < 0x7ff)) {
              uVar25 = 0;
              if (uVar21 < 0x40000000000000) {
                uVar25 = uVar21 >> 1 & 0x2fffffffffffff;
              }
              dVar32 = (double)(uVar15 << 0x34 | uVar25);
              goto LAB_00107275;
            }
          }
        }
      }
      if ((unaff_R13 & 1) == 0) {
        puts("failed to parse");
        printf(" 10 ^ %d ",uVar18);
LAB_00107316:
        bVar30 = false;
        iVar27 = 1;
      }
      else {
        dVar1 = testing_power_of_ten[lVar11 + 0x133];
        if ((dVar32 != dVar1) || (NAN(dVar32) || NAN(dVar1))) {
          printf(" 10 ^ %d ",uVar18);
          puts("bad parsing");
          printf("got: %.*e\n",dVar32,0x10);
          printf("reference: %.*e\n",dVar1,0x10);
          goto LAB_00107316;
        }
        bVar30 = true;
      }
      if (!bVar30) break;
      uVar22 = uVar26 + 1;
      bVar9 = 0x133 < (int)uVar26;
    } while ((int)uVar26 < 0x134);
    if (bVar9) {
      lVar11 = -0x132;
      do {
        uVar26 = (uint)lVar11;
        uVar22 = -uVar26;
        if (0 < (int)uVar26) {
          uVar22 = uVar26;
        }
        __len = 1;
        if (9 < uVar22) {
          uVar18 = (ulong)uVar22;
          uVar8 = 4;
          do {
            __len = uVar8;
            uVar10 = (uint)uVar18;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_001073c7;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_001073c7;
            }
            if (uVar10 < 10000) goto LAB_001073c7;
            uVar18 = uVar18 / 10000;
            uVar8 = __len + 4;
          } while (99999 < uVar10);
          __len = __len + 1;
        }
LAB_001073c7:
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct
                  ((ulong)local_f0,(char)__len - ((char)((ulong)lVar11 >> 0x18) >> 7));
        std::__detail::__to_chars_10_impl<unsigned_int>(local_f0[0] + (uVar26 >> 0x1f),__len,uVar22)
        ;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x108d07);
        local_110 = (byte *)&local_100;
        pbVar19 = (byte *)(puVar12 + 2);
        if ((byte *)*puVar12 == pbVar19) {
          local_100 = *(undefined8 *)pbVar19;
          uStack_f8 = puVar12[3];
        }
        else {
          local_100 = *(undefined8 *)pbVar19;
          local_110 = (byte *)*puVar12;
        }
        local_108 = puVar12[1];
        *puVar12 = pbVar19;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0]);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"parsing ",8);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(char *)local_110,local_108);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        bVar2 = *local_110;
        pbVar19 = local_110;
        if (bVar2 == 0x2d) {
          if ((byte)(local_110[1] - 0x30) < 10) {
            pbVar19 = local_110 + 1;
            goto LAB_001074f0;
          }
LAB_0010769d:
          pbVar14 = (byte *)0x0;
        }
        else {
LAB_001074f0:
          if (*pbVar19 != 0x30) {
            bVar20 = *pbVar19 - 0x30;
            if (bVar20 < 10) {
              uVar18 = (ulong)bVar20;
              bVar20 = pbVar19[1];
              pbVar14 = pbVar19;
              while( true ) {
                pbVar29 = pbVar14 + 1;
                if (9 < (byte)(bVar20 - 0x30)) break;
                uVar18 = (ulong)(byte)(bVar20 - 0x30) + uVar18 * 10;
                bVar20 = pbVar14[2];
                pbVar14 = pbVar29;
              }
              goto LAB_0010754d;
            }
            goto LAB_0010769d;
          }
          pbVar14 = (byte *)0x0;
          if (9 < (byte)(pbVar19[1] - 0x30)) {
            pbVar29 = pbVar19 + 1;
            uVar18 = 0;
LAB_0010754d:
            if (*pbVar29 == 0x2e) {
              if (9 < (byte)(pbVar29[1] - 0x30)) goto LAB_0010769d;
              pbVar14 = pbVar29 + 2;
              uVar18 = (ulong)(byte)(pbVar29[1] - 0x30) + uVar18 * 10;
              bVar20 = pbVar29[2];
              while ((byte)(bVar20 - 0x30) < 10) {
                uVar18 = (ulong)(byte)(bVar20 - 0x30) + uVar18 * 10;
                pbVar28 = pbVar14 + 1;
                pbVar14 = pbVar14 + 1;
                bVar20 = *pbVar28;
              }
              pbVar28 = pbVar29 + (1 - (long)pbVar14);
              pbVar29 = pbVar14;
            }
            else {
              pbVar28 = (byte *)0x0;
            }
            pbVar14 = pbVar29;
            if ((*pbVar29 | 0x20) == 0x65) {
              bVar9 = (pbVar29[1] - 0x2b & 0xfd) == 0;
              pbVar14 = pbVar29 + 1;
              if (bVar9) {
                pbVar14 = pbVar29 + 2;
              }
              bVar20 = pbVar29[(ulong)bVar9 + 1] - 0x30;
              if (bVar20 < 10) {
                bVar24 = pbVar14[1] - 0x30;
                uVar15 = (ulong)bVar24 + (ulong)bVar20 * 10;
                if (9 < bVar24) {
                  uVar15 = (ulong)bVar20;
                }
                pbVar23 = pbVar14 + 2;
                if (9 < bVar24) {
                  pbVar23 = pbVar14 + 1;
                }
                bVar24 = pbVar14[(ulong)(bVar24 < 10) + 1] - 0x30;
                pbVar14 = pbVar23 + (bVar24 < 10);
                uVar21 = (ulong)bVar24 + uVar15 * 10;
                if (9 < bVar24) {
                  uVar21 = uVar15;
                }
                bVar24 = *pbVar14;
                while ((byte)(bVar24 - 0x30) < 10) {
                  if ((long)uVar21 < 0x100000000) {
                    uVar21 = (ulong)(byte)(bVar24 - 0x30) + uVar21 * 10;
                  }
                  pbVar23 = pbVar14 + 1;
                  pbVar14 = pbVar14 + 1;
                  bVar24 = *pbVar23;
                }
                uVar15 = -uVar21;
                if (pbVar29[1] != 0x2d) {
                  uVar15 = uVar21;
                }
                pbVar28 = pbVar28 + uVar15;
              }
              if (9 < bVar20) goto LAB_0010769d;
            }
            iVar27 = (int)pbVar29 + ~(uint)pbVar19;
            if (0x12 < iVar27) {
              for (lVar16 = 0; (pbVar19[lVar16] == 0x30 || (pbVar19[lVar16] == 0x2e));
                  lVar16 = lVar16 + 1) {
              }
              if (0x12 < iVar27 - (int)lVar16) {
                pbVar14 = (byte *)fast_double_parser::parse_float_strtod
                                            ((char *)local_110,&local_118);
                goto LAB_0010769f;
              }
            }
            if (pbVar28 + -0x135 < (byte *)0xfffffffffffffd86) {
LAB_00107740:
              pbVar14 = (byte *)fast_double_parser::parse_float_strtod((char *)local_110,&local_118)
              ;
            }
            else if ((uVar18 >> 0x35 == 0) && (pbVar28 + 0x16 < (byte *)0x2d)) {
              if ((long)pbVar28 < 0) {
                local_118 = (double)(long)uVar18 /
                            *(double *)
                             (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                              power_of_ten + (long)pbVar28 * -8);
              }
              else {
                local_118 = (double)(long)uVar18 *
                            *(double *)
                             (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                              power_of_ten + (long)pbVar28 * 8);
              }
              if (bVar2 == 0x2d) {
                local_118 = -local_118;
              }
            }
            else {
              if (uVar18 != 0) {
                uVar15 = 0x3f;
                if (uVar18 != 0) {
                  for (; uVar18 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                uVar18 = uVar18 << ((byte)(uVar15 ^ 0x3f) & 0x3f);
                auVar3._8_8_ = 0;
                auVar3._0_8_ = uVar18;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *(ulong *)(fast_double_parser::
                                          compute_float_64(long,unsigned_long,bool,bool*)::
                                          mantissa_64 + (long)pbVar28 * 8 + 0xa28);
                auVar3 = auVar3 * auVar5;
                if ((((~auVar3._8_4_ & 0x1ff) != 0) || (!CARRY8(auVar3._0_8_,uVar18))) ||
                   (auVar4._8_8_ = 0, auVar4._0_8_ = uVar18, auVar6._8_8_ = 0,
                   auVar6._0_8_ = *(ulong *)(fast_double_parser::
                                             compute_float_64(long,unsigned_long,bool,bool*)::
                                             mantissa_128 + (long)pbVar28 * 8 + 0xa28),
                   auVar7._8_8_ = 0, auVar7._0_8_ = SUB168(auVar4 * auVar6,8),
                   auVar3 = auVar3 + auVar7,
                   uVar18 <= ~SUB168(auVar4 * auVar6,0) ||
                   ((~auVar3._8_4_ & 0x1ff) != 0 || auVar3._0_8_ != -1))) {
                  uVar18 = auVar3._8_8_ >> (9U - (auVar3[0xf] >> 7) & 0x3f);
                  uVar22 = (uint)uVar18;
                  if (((auVar3 & (undefined1  [16])0x1ff) != (undefined1  [16])0x0 ||
                       auVar3._0_8_ != 0) || ((uVar22 & 3) != 1)) {
                    uVar18 = (uVar22 & 1) + uVar18;
                    uVar15 = (((long)pbVar28 * 0x3526a >> 0x10) + 0x43f) -
                             (((auVar3._8_8_ >> 0x3f ^ 1) + (uVar15 ^ 0x3f)) -
                             (ulong)(0x3fffffffffffff < uVar18));
                    if ((uVar15 != 0) && (uVar15 < 0x7ff)) {
                      uVar21 = 0;
                      if (uVar18 < 0x40000000000000) {
                        uVar21 = uVar18 >> 1 & 0xefffffffffffff;
                      }
                      local_118 = (double)((ulong)(bVar2 == 0x2d) << 0x3f | uVar21 | uVar15 << 0x34)
                      ;
                      goto LAB_0010769f;
                    }
                  }
                }
                local_118 = 0.0;
                goto LAB_00107740;
              }
              local_118 = -0.0;
              if (bVar2 != 0x2d) {
                local_118 = 0.0;
              }
            }
          }
        }
LAB_0010769f:
        dVar32 = local_118;
        if (pbVar14 == (byte *)0x0) {
          printf("fast_double_parser refused to parse %s\n");
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar17,"fast_double_parser refused to parse");
LAB_00107af2:
          __cxa_throw(prVar17,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (pbVar14 != local_110 + local_108) {
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar17,"does not point at the end");
          goto LAB_00107af2;
        }
        dVar1 = testing_power_of_ten[lVar11 + 0x133];
        if ((local_118 != dVar1) || (NAN(local_118) || NAN(dVar1))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"fast_double_parser disagrees",0x1c);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          printf("fast_double_parser: %.*e\n",dVar32,0x10);
          printf("reference: %.*e\n",dVar1,0x10);
          printf("string: %s\n",local_110);
          prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar17,"fast_double_parser disagrees");
          goto LAB_00107af2;
        }
        if (local_110 != (byte *)&local_100) {
          operator_delete(local_110);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x135);
      negative_subsubnormal_to_negative_zero();
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"All ok",6);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      puts("Good!");
      iVar27 = 0;
    }
  }
  return iVar27;
}

Assistant:

int main() {
  const int evl_method = FLT_EVAL_METHOD;
  printf("FLT_EVAL_METHOD = %d\n", evl_method);
  bool is_pow_correct{1e-308 == std::pow(10,-308)};
  if(!is_pow_correct) {
    printf("It appears that your system has bad floating-point support since 1e-308 differs from std::pow(10,-308).\n");
    printf("Aborting further tests.");
    return EXIT_SUCCESS;
  } 
  issue2093();
  Assert(basic_test_64bit("1090544144181609348835077142190",0x1.b8779f2474dfbp+99));
  Assert(basic_test_64bit("4503599627370496.5", 4503599627370496.5));
  Assert(basic_test_64bit("4503599627370497.5", 4503599627370497.5));
  Assert(basic_test_64bit("0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375", 0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375));
  Assert(basic_test_64bit("0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375", 0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375));
  issue63();
  issue40();
  issue23();
  issue32();
  issue50_fastpath();
  issue50_off_fastpath();
  issue23_2();
  unit_tests();
  for (int p = -306; p <= 308; p++) {
    if (p == 23)
      p++;
    printf(".");
    fflush(NULL);
    bool success;
    double d = fast_double_parser::compute_float_64(p, 1, false, &success);
    if (!success) {
      printf("failed to parse\n");
      printf(" 10 ^ %d ", p);

      return EXIT_FAILURE;
    }
    if (d != testing_power_of_ten[p + 307]) {
      printf(" 10 ^ %d ", p);

      printf("bad parsing\n");
      printf("got: %.*e\n", DBL_DIG + 1, d);
      printf("reference: %.*e\n", DBL_DIG + 1, testing_power_of_ten[p + 307]);

      return EXIT_FAILURE;
    }
  }
  for (int p = -306; p <= 308; p++) {
    double d;
    std::string s = "1e"+std::to_string(p);
    std::cout << "parsing " << s << std::endl;
    const char * isok = fast_double_parser::parse_number(s.c_str(), &d);
    if (!isok) {
      printf("fast_double_parser refused to parse %s\n", s.c_str());
      throw std::runtime_error("fast_double_parser refused to parse");
    }
    if(isok != s.c_str() + s.size()) throw std::runtime_error("does not point at the end");
    if (d != testing_power_of_ten[p + 307]) {
      std::cerr << "fast_double_parser disagrees" << std::endl;
      printf("fast_double_parser: %.*e\n", DBL_DIG + 1, d);
      printf("reference: %.*e\n", DBL_DIG + 1, testing_power_of_ten[p + 307]);
      printf("string: %s\n", s.c_str());
      throw std::runtime_error("fast_double_parser disagrees");
    }
  }
  negative_subsubnormal_to_negative_zero();
  std::cout << std::endl;
  std::cout << "All ok" << std::endl;
  printf("Good!\n");
  return EXIT_SUCCESS;
}